

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

void indexLevels(xformDatabase *xdb)

{
  int local_1c;
  transformData *ptStack_18;
  int n;
  transformData *xform;
  xformDatabase *xdb_local;
  
  if (xdb != (xformDatabase *)0x0) {
    local_1c = 0;
    for (ptStack_18 = xdb->xforms; ptStack_18 != (transformData *)0x0; ptStack_18 = ptStack_18->next
        ) {
      if ((ptStack_18->type == 1) || (ptStack_18->type == 2)) {
        ptStack_18->num = local_1c;
        xdb->level[local_1c] = ptStack_18;
        local_1c = local_1c + 1;
      }
    }
    xdb->nlevs = local_1c;
  }
  return;
}

Assistant:

void indexLevels(xformDatabase* xdb) {
   transformData* xform = NULL;
   int n = 0;
   
   if (xdb) {
      n = 0;
      for(xform = xdb->xforms; xform; xform = xform->next) {
         if (xform->type == ROTxform || xform->type == TRANSxform) {
            /* the NULL transformation does not get indexed (it is not a scan dimension) */
	    xform->num = n;
            xdb->level[n++] = xform;
         }
      }
      xdb->nlevs = n;
   }
}